

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

void ghod_hitsu(monst *priest)

{
  xchar bx;
  xchar by;
  char cVar1;
  boolean bVar2;
  int iVar3;
  int dy;
  mkroom *pmVar4;
  char *pcVar5;
  mkroom *troom;
  int roomno;
  int ay;
  int ax;
  int y;
  int x;
  monst *priest_local;
  
  cVar1 = temple_occupied(u.urooms);
  if ((cVar1 != 0) && (bVar2 = has_shrine(priest), bVar2 != '\0')) {
    bx = priest->field_0x76;
    by = priest->field_0x77;
    pmVar4 = level->rooms + (cVar1 + -3);
    ax._0_1_ = bx;
    ay._0_1_ = by;
    if (((u.ux == bx) && (u.uy == by)) || (bVar2 = linedup(u.ux,u.uy,bx,by), bVar2 == '\0')) {
      if (level->locations[u.ux][u.uy].typ == '\x17') {
        if ((int)u.ux == pmVar4->lx + -1) {
          ax._0_1_ = pmVar4->hx;
          ay._0_1_ = u.uy;
        }
        else if ((int)u.ux == pmVar4->hx + 1) {
          ax._0_1_ = pmVar4->lx;
          ay._0_1_ = u.uy;
        }
        else if ((int)u.uy == pmVar4->ly + -1) {
          ax._0_1_ = u.ux;
          ay._0_1_ = pmVar4->hy;
        }
        else if ((int)u.uy == pmVar4->hy + 1) {
          ax._0_1_ = u.ux;
          ay._0_1_ = pmVar4->ly;
        }
      }
      else {
        iVar3 = rn2(4);
        if (iVar3 == 0) {
          ax._0_1_ = u.ux;
          ay._0_1_ = pmVar4->ly;
        }
        else if (iVar3 == 1) {
          ax._0_1_ = u.ux;
          ay._0_1_ = pmVar4->hy;
        }
        else if (iVar3 == 2) {
          ax._0_1_ = pmVar4->lx;
          ay._0_1_ = u.uy;
        }
        else {
          ax._0_1_ = pmVar4->hx;
          ay._0_1_ = u.uy;
        }
      }
      bVar2 = linedup(u.ux,u.uy,(schar)ax,(schar)ay);
      if (bVar2 == '\0') {
        return;
      }
    }
    iVar3 = rn2(3);
    if (iVar3 == 0) {
      pcVar5 = a_gname_at(bx,by);
      pline("%s roars in anger:  \"Thou shalt suffer!\"",pcVar5);
    }
    else if (iVar3 == 1) {
      pcVar5 = a_gname_at(bx,by);
      pcVar5 = s_suffix(pcVar5);
      pline("%s voice booms:  \"How darest thou harm my servant!\"",pcVar5);
    }
    else {
      pcVar5 = a_gname_at(bx,by);
      pline("%s roars:  \"Thou dost profane my shrine!\"",pcVar5);
    }
    iVar3 = sgn((int)tbx);
    dy = sgn((int)tby);
    buzz(-0xf,6,(schar)ax,(schar)ay,iVar3,dy);
    exercise(2,'\0');
  }
  return;
}

Assistant:

void ghod_hitsu(struct monst *priest)
{
	int x, y, ax, ay, roomno = (int)temple_occupied(u.urooms);
	struct mkroom *troom;

	if (!roomno || !has_shrine(priest))
		return;

	ax = x = EPRI(priest)->shrpos.x;
	ay = y = EPRI(priest)->shrpos.y;
	troom = &level->rooms[roomno - ROOMOFFSET];

	if ((u.ux == x && u.uy == y) || !linedup(u.ux, u.uy, x, y)) {
	    if (IS_DOOR(level->locations[u.ux][u.uy].typ)) {

		if (u.ux == troom->lx - 1) {
		    x = troom->hx;
		    y = u.uy;
		} else if (u.ux == troom->hx + 1) {
		    x = troom->lx;
		    y = u.uy;
		} else if (u.uy == troom->ly - 1) {
		    x = u.ux;
		    y = troom->hy;
		} else if (u.uy == troom->hy + 1) {
		    x = u.ux;
		    y = troom->ly;
		}
	    } else {
		switch(rn2(4)) {
		case 0:  x = u.ux; y = troom->ly; break;
		case 1:  x = u.ux; y = troom->hy; break;
		case 2:  x = troom->lx; y = u.uy; break;
		default: x = troom->hx; y = u.uy; break;
		}
	    }
	    if (!linedup(u.ux, u.uy, x, y)) return;
	}

	switch(rn2(3)) {
	case 0:
	    pline("%s roars in anger:  \"Thou shalt suffer!\"",
			a_gname_at(ax, ay));
	    break;
	case 1:
	    pline("%s voice booms:  \"How darest thou harm my servant!\"",
			s_suffix(a_gname_at(ax, ay)));
	    break;
	default:
	    pline("%s roars:  \"Thou dost profane my shrine!\"",
			a_gname_at(ax, ay));
	    break;
	}

	buzz(-10-(AD_ELEC-1), 6, x, y, sgn(tbx), sgn(tby)); /* bolt of lightning */
	exercise(A_WIS, FALSE);
}